

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O2

void __thiscall asmjit::v1_14::ZoneBitVector::or_(ZoneBitVector *this,ZoneBitVector *other)

{
  ulong *puVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  lVar3 = *(long *)this;
  uVar2 = *(uint *)(this + 8);
  if (*(uint *)(other + 8) < *(uint *)(this + 8)) {
    uVar2 = *(uint *)(other + 8);
  }
  lVar4 = *(long *)other;
  for (uVar5 = 0; uVar2 + 0x3f >> 6 != uVar5; uVar5 = uVar5 + 1) {
    puVar1 = (ulong *)(lVar3 + uVar5 * 8);
    *puVar1 = *puVar1 | *(ulong *)(lVar4 + uVar5 * 8);
  }
  uVar2 = *(uint *)(this + 8);
  if ((uVar2 & 0x3f) != 0) {
    puVar1 = (ulong *)(*(long *)this + (ulong)(uVar2 >> 6) * 8);
    *puVar1 = *puVar1 & ~(-1L << ((byte)uVar2 & 0x3f));
  }
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void or_(const ZoneBitVector& other) noexcept {
    BitWord* dst = _data;
    const BitWord* src = other._data;

    uint32_t commonBitWordCount = _wordsPerBits(Support::min(_size, other._size));
    for (uint32_t i = 0; i < commonBitWordCount; i++)
      dst[i] = dst[i] | src[i];
    _clearUnusedBits();
  }